

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void openStatTable(Parse *pParse,int iDb,int iStatCur,char *zWhere,char *zWhereType)

{
  Pgno iTab;
  sqlite3 *db;
  char *zName;
  Vdbe *p;
  Db *pDVar1;
  Table *pTVar2;
  char **ppcVar3;
  long lVar4;
  long in_FS_OFFSET;
  u8 aCreateTbl [3];
  u32 aRoot [3];
  ushort local_47;
  undefined1 local_45;
  undefined1 *local_44;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  p = sqlite3GetVdbe(pParse);
  local_44 = &DAT_aaaaaaaaaaaaaaaa;
  local_3c = 0xaaaaaaaa;
  local_47 = 0xaaaa;
  local_45 = 0xaa;
  if (p != (Vdbe *)0x0) {
    pDVar1 = db->aDb + iDb;
    ppcVar3 = &openStatTable::aTable[0].zCols;
    lVar4 = 0;
    do {
      zName = ((anon_struct_16_2_c5ef36f1 *)(ppcVar3 + -1))->zName;
      *(undefined1 *)((long)&local_47 + lVar4) = 0;
      pTVar2 = sqlite3FindTable(db,zName,pDVar1->zDbSName);
      if (pTVar2 == (Table *)0x0) {
        if (lVar4 == 0) {
          sqlite3NestedParse(pParse,"CREATE TABLE %Q.%s(%s)",pDVar1->zDbSName,zName,*ppcVar3);
          local_44._0_4_ = pParse->regRoot;
          local_47._0_1_ = 0x10;
        }
      }
      else {
        iTab = pTVar2->tnum;
        *(Pgno *)((long)&local_44 + lVar4 * 4) = iTab;
        sqlite3TableLock(pParse,iDb,iTab,'\x01',zName);
        if (zWhere == (char *)0x0) {
          sqlite3VdbeAddOp3(p,0x91,iTab,iDb,0);
        }
        else {
          sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE %s=%Q",pDVar1->zDbSName,zName,
                             zWhereType);
        }
      }
      lVar4 = lVar4 + 1;
      ppcVar3 = ppcVar3 + 2;
    } while (lVar4 != 3);
    sqlite3VdbeAddOp4Int(p,0x71,iStatCur,(int)local_44,iDb,3);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = local_47 & 0xff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void openStatTable(
  Parse *pParse,          /* Parsing context */
  int iDb,                /* The database we are looking in */
  int iStatCur,           /* Open the sqlite_stat1 table on this cursor */
  const char *zWhere,     /* Delete entries for this table or index */
  const char *zWhereType  /* Either "tbl" or "idx" */
){
  static const struct {
    const char *zName;
    const char *zCols;
  } aTable[] = {
    { "sqlite_stat1", "tbl,idx,stat" },
#if defined(SQLITE_ENABLE_STAT4)
    { "sqlite_stat4", "tbl,idx,neq,nlt,ndlt,sample" },
#else
    { "sqlite_stat4", 0 },
#endif
    { "sqlite_stat3", 0 },
  };
  int i;
  sqlite3 *db = pParse->db;
  Db *pDb;
  Vdbe *v = sqlite3GetVdbe(pParse);
  u32 aRoot[ArraySize(aTable)];
  u8 aCreateTbl[ArraySize(aTable)];
#ifdef SQLITE_ENABLE_STAT4
  const int nToOpen = OptimizationEnabled(db,SQLITE_Stat4) ? 2 : 1;
#else
  const int nToOpen = 1;
#endif

  if( v==0 ) return;
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3VdbeDb(v)==db );
  pDb = &db->aDb[iDb];

  /* Create new statistic tables if they do not exist, or clear them
  ** if they do already exist.
  */
  for(i=0; i<ArraySize(aTable); i++){
    const char *zTab = aTable[i].zName;
    Table *pStat;
    aCreateTbl[i] = 0;
    if( (pStat = sqlite3FindTable(db, zTab, pDb->zDbSName))==0 ){
      if( i<nToOpen ){
        /* The sqlite_statN table does not exist. Create it. Note that a
        ** side-effect of the CREATE TABLE statement is to leave the rootpage
        ** of the new table in register pParse->regRoot. This is important
        ** because the OpenWrite opcode below will be needing it. */
        sqlite3NestedParse(pParse,
            "CREATE TABLE %Q.%s(%s)", pDb->zDbSName, zTab, aTable[i].zCols
        );
        aRoot[i] = (u32)pParse->regRoot;
        aCreateTbl[i] = OPFLAG_P2ISREG;
      }
    }else{
      /* The table already exists. If zWhere is not NULL, delete all entries
      ** associated with the table zWhere. If zWhere is NULL, delete the
      ** entire contents of the table. */
      aRoot[i] = pStat->tnum;
      sqlite3TableLock(pParse, iDb, aRoot[i], 1, zTab);
      if( zWhere ){
        sqlite3NestedParse(pParse,
           "DELETE FROM %Q.%s WHERE %s=%Q",
           pDb->zDbSName, zTab, zWhereType, zWhere
        );
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
      }else if( db->xPreUpdateCallback ){
        sqlite3NestedParse(pParse, "DELETE FROM %Q.%s", pDb->zDbSName, zTab);
#endif
      }else{
        /* The sqlite_stat[134] table already exists.  Delete all rows. */
        sqlite3VdbeAddOp2(v, OP_Clear, (int)aRoot[i], iDb);
      }
    }
  }

  /* Open the sqlite_stat[134] tables for writing. */
  for(i=0; i<nToOpen; i++){
    assert( i<ArraySize(aTable) );
    sqlite3VdbeAddOp4Int(v, OP_OpenWrite, iStatCur+i, (int)aRoot[i], iDb, 3);
    sqlite3VdbeChangeP5(v, aCreateTbl[i]);
    VdbeComment((v, aTable[i].zName));
  }
}